

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psi.cpp
# Opt level: O2

int __thiscall pg::PSISolver::switch_strategy_seq(PSISolver *this,int pl)

{
  uint a;
  Game *pGVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  PSISolver *pPVar7;
  Error *this_00;
  uint a_00;
  char *pcVar8;
  byte bVar9;
  long lVar10;
  int n;
  uint *puVar11;
  long lVar12;
  ulong uVar13;
  _label_vertex local_70;
  long local_60;
  int local_54;
  _label_vertex local_50;
  _label_vertex local_40;
  
  lVar12 = 0;
  iVar5 = 0;
  pPVar7 = this;
  do {
    lVar10 = ((this->super_Solver).game)->n_vertices;
    if (lVar10 <= lVar12) {
      if (pl == 0) {
        for (lVar12 = 0; lVar2 = halt, lVar12 < lVar10; lVar12 = lVar12 + 1) {
          if (*(int *)(halt + lVar12 * 4) != 0) {
            bVar3 = si_val_less(pPVar7,-1,(int)lVar12);
            if (bVar3) {
              *(undefined4 *)(lVar2 + lVar12 * 4) = 0;
              if (1 < (this->super_Solver).trace) {
                poVar6 = std::operator<<((this->super_Solver).logger,
                                         "\x1b[1;37mno longer halt\x1b[m before vertex ");
                local_70.g = (this->super_Solver).game;
                local_70.v = (int)lVar12;
                pPVar7 = (PSISolver *)operator<<(poVar6,&local_70);
                std::endl<char,std::char_traits<char>>((ostream *)pPVar7);
                lVar10 = ((this->super_Solver).game)->n_vertices;
              }
              iVar5 = iVar5 + 1;
            }
          }
        }
      }
      return iVar5;
    }
    iVar4 = *(int *)(done + lVar12 * 4);
    if (iVar4 != 3) {
      if (iVar4 == 0) {
        this_00 = (Error *)__cxa_allocate_exception(0x40);
        Error::Error(this_00,"logic error",
                     "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/psi.cpp"
                     ,0x16c);
        __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
      }
      pPVar7 = this;
      iVar4 = Solver::owner(&this->super_Solver,(int)lVar12);
      if (iVar4 == pl) {
        pGVar1 = (this->super_Solver).game;
        bVar9 = 0;
        a_00 = *(uint *)(str + lVar12 * 4);
        local_60 = str;
        puVar11 = (uint *)(pGVar1->_outedges + pGVar1->_firstouts[lVar12]);
        local_54 = iVar5;
        while( true ) {
          a = *puVar11;
          uVar13 = (ulong)(int)a;
          if (uVar13 == 0xffffffffffffffff) break;
          if (((((this->super_Solver).disabled)->_bits[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) == 0) &&
             (a != a_00)) {
            lVar10 = (long)(int)a_00;
            if (pl == 0) {
              bVar3 = si_val_less(pPVar7,-(uint)(*(int *)(halt + lVar10 * 4) != 0) | a_00,
                                  -(uint)(*(int *)(halt + uVar13 * 4) != 0) | a);
              if (bVar3) {
                if (1 < (this->super_Solver).trace) {
                  poVar6 = (this->super_Solver).logger;
                  pcVar8 = "\x1b[1;37mupdate even strategy\x1b[m \x1b[1;33m";
                  goto LAB_00158d16;
                }
                goto LAB_00158e2c;
              }
            }
            else {
              bVar3 = si_val_less(pPVar7,-(uint)(*(int *)(halt + uVar13 * 4) != 0) | a,
                                  -(uint)(*(int *)(halt + lVar10 * 4) != 0) | a_00);
              if (bVar3) {
                if (1 < (this->super_Solver).trace) {
                  poVar6 = (this->super_Solver).logger;
                  pcVar8 = "\x1b[1;37mupdate odd strategy\x1b[m \x1b[1;33m";
LAB_00158d16:
                  poVar6 = std::operator<<(poVar6,pcVar8);
                  local_70.g = (this->super_Solver).game;
                  local_70.v = (int)lVar12;
                  poVar6 = operator<<(poVar6,&local_70);
                  poVar6 = std::operator<<(poVar6,"\x1b[m from \x1b[1;33m");
                  local_40.g = (this->super_Solver).game;
                  local_40.v = a_00;
                  pPVar7 = (PSISolver *)operator<<(poVar6,&local_40);
                  poVar6 = std::operator<<((ostream *)pPVar7,"\x1b[m (");
                  iVar5 = si_top_val(pPVar7,a_00);
                  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
                  pcVar8 = ")H";
                  if (*(int *)(halt + lVar10 * 4) == 0) {
                    pcVar8 = ")";
                  }
                  poVar6 = std::operator<<(poVar6,pcVar8);
                  poVar6 = std::operator<<(poVar6," to \x1b[1;33m");
                  local_50.g = (this->super_Solver).game;
                  local_50.v = a;
                  pPVar7 = (PSISolver *)operator<<(poVar6,&local_50);
                  poVar6 = std::operator<<((ostream *)pPVar7,"\x1b[m (");
                  iVar5 = si_top_val(pPVar7,a);
                  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
                  pcVar8 = ")H";
                  if (*(int *)(halt + uVar13 * 4) == 0) {
                    pcVar8 = ")";
                  }
                  pPVar7 = (PSISolver *)std::operator<<(poVar6,pcVar8);
                  std::endl<char,std::char_traits<char>>((ostream *)pPVar7);
                  local_60 = str;
                }
LAB_00158e2c:
                bVar9 = 1;
                *(uint *)(local_60 + lVar12 * 4) = a;
                a_00 = a;
              }
            }
          }
          puVar11 = puVar11 + 1;
        }
        iVar5 = local_54 + (uint)bVar9;
      }
    }
    lVar12 = lVar12 + 1;
  } while( true );
}

Assistant:

int
PSISolver::switch_strategy_seq(int pl)
{
    int res = 0;

    for (int n=0; n<nodecount(); n++) {
        if (done[n] == 3) continue; // skip "disabled or won"
        if (done[n] == 0) LOGIC_ERROR; // expecting done==1 or done==2
        if (owner(n) != pl) continue; // only change strategy for vertices of player <pl>

        bool changed = false;
        int cur_strat = str[n];
        for (auto curedge = outs(n); *curedge != -1; curedge++) {
            int to = *curedge;
            if (disabled[to]) continue; // skip strategy to disabled
            if (to == cur_strat) continue; // skip strategy to same
            if (pl == 0) {
                // improving for player Even
                if (si_val_less(halt[cur_strat] ? -1 : cur_strat, halt[to] ? -1 : to)) {
#ifndef NDEBUG
                    if (trace >= 2) {
                        logger << "\033[1;37mupdate even strategy\033[m \033[1;33m" << label_vertex(n) << "\033[m from \033[1;33m" << label_vertex(cur_strat) << "\033[m (" << si_top_val(cur_strat) << (halt[cur_strat]?")H":")") << " to \033[1;33m" << label_vertex(to) << "\033[m (" << si_top_val(to) << (halt[to] ? ")H" : ")") << std::endl;
                    }
#endif
                    str[n] = cur_strat = to;
                    changed = true;
                }
            } else {
                // improving for player Odd
                if (si_val_less(halt[to] ? -1 : to, halt[cur_strat] ? -1 : cur_strat)) {
#ifndef NDEBUG
                    if (trace >= 2) {
                        logger << "\033[1;37mupdate odd strategy\033[m \033[1;33m" << label_vertex(n) << "\033[m from \033[1;33m" << label_vertex(cur_strat) << "\033[m (" << si_top_val(cur_strat) << (halt[cur_strat]?")H":")") << " to \033[1;33m" << label_vertex(to) << "\033[m (" << si_top_val(to) << (halt[to] ? ")H" : ")") << std::endl;
                    }
#endif
                    str[n] = cur_strat = to;
                    changed = true;
                }
            }
        }
        if (changed) res++;
    }

    if (pl == 0) {
        for (int n=0; n<nodecount(); n++) {
            if (halt[n] and si_val_less(-1, n)) {
                halt[n] = 0; // stop halting
#ifndef NDEBUG
                if (trace >= 2) {
                    logger << "\033[1;37mno longer halt\033[m before vertex " << label_vertex(n) << std::endl;
                }
#endif
                res++;
            }
        }
    }

    return res;
}